

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int fmt::v5::getpagesize(void)

{
  long lVar1;
  basic_string_view<char> *this;
  int in_stack_0000002c;
  long size;
  undefined1 in_stack_00000038 [16];
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = sysconf(0x1e);
  if (lVar1 < 0) {
    this = (basic_string_view<char> *)__cxa_allocate_exception(0x18);
    __errno_location();
    basic_string_view<char>::basic_string_view(this,in_stack_ffffffffffffffc8);
    system_error::system_error<>
              ((system_error *)size,in_stack_0000002c,(string_view)in_stack_00000038);
    __cxa_throw(this,&system_error::typeinfo,system_error::~system_error);
  }
  return (int)lVar1;
}

Assistant:

long getpagesize() {
#ifdef _WIN32
  SYSTEM_INFO si;
  GetSystemInfo(&si);
  return si.dwPageSize;
#else
  long size = FMT_POSIX_CALL(sysconf(_SC_PAGESIZE));
  if (size < 0)
    FMT_THROW(system_error(errno, "cannot get memory page size"));
  return size;
#endif
}